

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O0

void __thiscall
soplex::CLUFactor<double>::vSolveUrightNoNZ
          (CLUFactor<double> *this,double *vec,double *rhs,int *ridx,int rn,double eps)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  bool bVar7;
  int iVar8;
  double *pdVar9;
  reference pvVar10;
  int iVar11;
  int *in_RCX;
  int *piVar12;
  long in_RDX;
  long in_RSI;
  double in_RDI;
  int in_R8D;
  double dVar13;
  double dVar14;
  double *val;
  int *idx;
  double y;
  double x;
  double *cval;
  int *cbeg;
  int *clen;
  int *cidx;
  int *rperm;
  int *corig;
  int *rorig;
  int c;
  int r;
  int k;
  int j;
  int i;
  double *in_stack_ffffffffffffff60;
  double *a;
  int *local_98;
  int local_38;
  int local_34;
  int local_24;
  int *local_20;
  long local_18;
  long local_10;
  
  lVar1 = *(long *)((long)in_RDI + 0x38);
  lVar2 = *(long *)((long)in_RDI + 0x48);
  lVar3 = *(long *)((long)in_RDI + 0x40);
  lVar4 = *(long *)((long)in_RDI + 0x180);
  local_24 = in_R8D;
  local_20 = in_RCX;
  local_18 = in_RDX;
  local_10 = in_RSI;
  pdVar9 = std::vector<double,_std::allocator<double>_>::data
                     ((vector<double,_std::allocator<double>_> *)0x295f0c);
  lVar5 = *(long *)((long)in_RDI + 0x1a8);
  lVar6 = *(long *)((long)in_RDI + 0x1a0);
LAB_00295f30:
  if (0 < local_24) {
    if ((double)local_24 <= (double)*local_20 * 0.2) {
      iVar8 = deQueueMax(local_20,&local_24);
      iVar11 = *(int *)(lVar1 + (long)iVar8 * 4);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xe0),
                           (long)iVar11);
      dVar13 = *pvVar10 * *(double *)(local_18 + (long)iVar11 * 8);
      *(undefined8 *)(local_18 + (long)iVar11 * 8) = 0;
      bVar7 = isNotZero<double,double>((double)in_stack_ffffffffffffff60,in_RDI);
      if (bVar7) {
        iVar11 = *(int *)(lVar2 + (long)iVar8 * 4);
        *(double *)(local_10 + (long)iVar11 * 8) = dVar13;
        in_stack_ffffffffffffff60 = pdVar9 + *(int *)(lVar6 + (long)iVar11 * 4);
        local_98 = (int *)(lVar4 + (long)*(int *)(lVar6 + (long)iVar11 * 4) * 4);
        local_38 = *(int *)(lVar5 + (long)iVar11 * 4);
        while (iVar11 = local_38 + -1, 0 < local_38) {
          piVar12 = local_98 + 1;
          iVar8 = *local_98;
          dVar14 = *(double *)(local_18 + (long)iVar8 * 8);
          local_98 = piVar12;
          local_38 = iVar11;
          if ((dVar14 != 0.0) || (NAN(dVar14))) {
            dVar14 = dVar14 - dVar13 * *in_stack_ffffffffffffff60;
            *(double *)(local_18 + (long)iVar8 * 8) =
                 (double)(-(ulong)(dVar14 == 0.0) & 0x2b2bff2ee48e0530) + dVar14;
            in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1;
          }
          else {
            a = in_stack_ffffffffffffff60 + 1;
            dVar14 = *in_stack_ffffffffffffff60;
            bVar7 = isNotZero<double,double>((double)a,in_RDI);
            in_stack_ffffffffffffff60 = a;
            if (bVar7) {
              *(double *)(local_18 + (long)iVar8 * 8) = -dVar13 * dVar14;
              enQueueMax(local_20,&local_24,*(int *)(lVar3 + (long)iVar8 * 4));
              in_stack_ffffffffffffff60 = a;
            }
          }
        }
      }
      goto LAB_00295f30;
    }
    for (local_34 = *local_20; -1 < local_34; local_34 = local_34 + -1) {
      iVar11 = *(int *)(lVar1 + (long)local_34 * 4);
      pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)((long)in_RDI + 0xe0),
                           (long)iVar11);
      dVar13 = *pvVar10 * *(double *)(local_18 + (long)iVar11 * 8);
      *(undefined8 *)(local_18 + (long)iVar11 * 8) = 0;
      bVar7 = isNotZero<double,double>((double)in_stack_ffffffffffffff60,in_RDI);
      if (bVar7) {
        iVar11 = *(int *)(lVar2 + (long)local_34 * 4);
        *(double *)(local_10 + (long)iVar11 * 8) = dVar13;
        in_stack_ffffffffffffff60 = pdVar9 + *(int *)(lVar6 + (long)iVar11 * 4);
        local_98 = (int *)(lVar4 + (long)*(int *)(lVar6 + (long)iVar11 * 4) * 4);
        local_38 = *(int *)(lVar5 + (long)iVar11 * 4);
        while (0 < local_38) {
          *(double *)(local_18 + (long)*local_98 * 8) =
               *(double *)(local_18 + (long)*local_98 * 8) - dVar13 * *in_stack_ffffffffffffff60;
          in_stack_ffffffffffffff60 = in_stack_ffffffffffffff60 + 1;
          local_98 = local_98 + 1;
          local_38 = local_38 + -1;
        }
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::vSolveUrightNoNZ(R* vec,
                                    R* rhs, int* ridx, int rn, R eps)
{
   int i, j, k, r, c;
   int* rorig, *corig;
   int* rperm;
   int* cidx, *clen, *cbeg;
   R* cval;
   R x, y;

   int* idx;
   R* val;

   rorig = row.orig;
   corig = col.orig;
   rperm = row.perm;

   cidx = u.col.idx;
   cval = u.col.val.data();
   clen = u.col.len;
   cbeg = u.col.start;

   while(rn > 0)
   {
      if(rn > *ridx * verySparseFactor4right)
      {
         /* continue with dense case */
         for(i = *ridx; i >= 0; --i)
         {
            assert(i >= 0 && i < thedim);
            r = rorig[i];
            assert(r >= 0 && r < thedim);
            x = diag[r] * rhs[r];
            rhs[r] = 0;

            if(isNotZero(x, eps))
            {
               c = corig[i];
               vec[c] = x;
               val = &cval[cbeg[c]];
               idx = &cidx[cbeg[c]];
               j = clen[c];

               while(j-- > 0)
               {
                  assert(*idx >= 0 && *idx < thedim);
                  rhs[*idx++] -= x * (*val++);
               }
            }
         }

         break;
      }

      /*      Find nonzero with highest permuted row index and setup i and r
       */
      i = deQueueMax(ridx, &rn);

      assert(i >= 0 && i < thedim);

      r = rorig[i];

      assert(r >= 0 && r < thedim);

      x = diag[r] * rhs[r];

      rhs[r] = 0;

      if(isNotZero(x, eps))
      {
         c = corig[i];
         vec[c] = x;
         val = &cval[cbeg[c]];
         idx = &cidx[cbeg[c]];
         j = clen[c];

         while(j-- > 0)
         {
            k = *idx++;
            assert(k >= 0 && k < thedim);
            y = rhs[k];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[k] = y;
                  enQueueMax(ridx, &rn, rperm[k]);
               }
            }
            else
            {
               y -= x * (*val++);
               y += (y == 0) ? SOPLEX_FACTOR_MARKER : 0;
               rhs[k] = y;
            }
         }
      }
   }
}